

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O0

int dwarf_get_INL_name(uint val,char **s_out)

{
  char **s_out_local;
  uint val_local;
  
  switch(val) {
  case 0:
    *s_out = "DW_INL_not_inlined";
    s_out_local._4_4_ = 0;
    break;
  case 1:
    *s_out = "DW_INL_inlined";
    s_out_local._4_4_ = 0;
    break;
  case 2:
    *s_out = "DW_INL_declared_not_inlined";
    s_out_local._4_4_ = 0;
    break;
  case 3:
    *s_out = "DW_INL_declared_inlined";
    s_out_local._4_4_ = 0;
    break;
  default:
    s_out_local._4_4_ = -1;
  }
  return s_out_local._4_4_;
}

Assistant:

int
dwarf_get_INL_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_INL_not_inlined:
        *s_out = "DW_INL_not_inlined";
        return DW_DLV_OK;
    case DW_INL_inlined:
        *s_out = "DW_INL_inlined";
        return DW_DLV_OK;
    case DW_INL_declared_not_inlined:
        *s_out = "DW_INL_declared_not_inlined";
        return DW_DLV_OK;
    case DW_INL_declared_inlined:
        *s_out = "DW_INL_declared_inlined";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}